

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

int __thiscall qpdf::Array::size(Array *this)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  int iVar2;
  QPDF_Array *pQVar3;
  
  pQVar3 = array(this);
  _Var1._M_head_impl =
       (pQVar3->sp)._M_t.
       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
       super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Sparse *)0x0) {
    iVar2 = (int)((ulong)((long)(pQVar3->elements).
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pQVar3->elements).
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  }
  else {
    iVar2 = (_Var1._M_head_impl)->size;
  }
  return iVar2;
}

Assistant:

int
Array::size() const
{
    auto a = array();
    return a->sp ? a->sp->size : int(a->elements.size());
}